

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::StringTypeInfo::Deserialize(StringTypeInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  StringTypeInfo *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::StringTypeInfo,_true> local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pSVar2 = (StringTypeInfo *)operator_new(0x58);
  StringTypeInfo(pSVar2);
  local_68.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pSVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::StringTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.internal.
              super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pSVar2);
  pSVar2 = shared_ptr<duckdb::StringTypeInfo,_true>::operator->(&local_68);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"collation");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pSVar2->collation,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010aeaa7;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pSVar2->collation,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010aeaa7;
  }
  operator_delete(local_50);
LAB_010aeaa7:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_68.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_68.internal.super___shared_ptr<duckdb::StringTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> StringTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<StringTypeInfo>(new StringTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "collation", result->collation);
	return std::move(result);
}